

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 24点.cpp
# Opt level: O1

bool jiesuan(int a,int b,int c,int d,string *cal)

{
  char cVar1;
  char cVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  string pos;
  bool local_179;
  undefined1 *local_178;
  ulong local_170;
  undefined1 local_168 [16];
  long *local_158;
  ulong local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  ulong local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  string *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_f8[0] = local_e8;
  local_a8 = cal;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"+-*/","");
  dVar12 = (double)a;
  dVar11 = (double)b;
  dVar13 = (double)c;
  dVar14 = (double)d;
  dVar15 = dVar12 * dVar11;
  dVar16 = dVar12 - dVar11;
  dVar17 = dVar12 + dVar11;
  dVar12 = dVar12 / dVar11;
  local_179 = true;
  uVar7 = 0;
  local_88 = (long)a << 5;
  local_90 = (long)b << 5;
  local_98 = (long)c << 5;
  local_a0 = (long)d << 5;
  local_d8 = dVar17;
  local_d0 = dVar16;
  local_c8 = dVar15;
  local_c0 = dVar14;
  local_b8 = dVar13;
  local_b0 = dVar12;
  do {
    cVar1 = local_f8[0][uVar7];
    uVar9 = 0;
    uVar6 = 0;
    do {
      cVar2 = local_f8[0][uVar9];
      lVar8 = 0;
      do {
        dVar11 = dVar15;
        if (((cVar1 != '*') && (dVar11 = dVar17, cVar1 != '+')) && (dVar11 = dVar16, cVar1 != '-'))
        {
          dVar11 = dVar12;
        }
        if (cVar2 == '*') {
          dVar11 = dVar11 * dVar13;
        }
        else if (cVar2 == '-') {
          dVar11 = dVar11 - dVar13;
        }
        else if (cVar2 == '+') {
          dVar11 = dVar11 + dVar13;
        }
        else {
          dVar11 = dVar11 / dVar13;
        }
        cVar3 = local_f8[0][lVar8];
        if (cVar3 == '*') {
          dVar11 = dVar11 * dVar14;
        }
        else if (cVar3 == '-') {
          dVar11 = dVar11 - dVar14;
        }
        else if (cVar3 == '+') {
          dVar11 = dVar11 + dVar14;
        }
        else {
          dVar11 = dVar11 / dVar14;
        }
        if ((dVar11 == 24.0) && (!NAN(dVar11))) {
          local_178 = local_168;
          lVar8 = *(long *)((long)&poker_dict_abi_cxx11_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p +
                           local_88);
          local_80 = uVar6;
          local_78 = uVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,lVar8,
                     *(long *)((long)poker_dict_abi_cxx11_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_88 + -0x18) +
                     lVar8);
          std::__cxx11::string::_M_replace_aux((ulong)&local_178,local_170,0,'\x01');
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_178,
                                      *(ulong *)((long)&poker_dict_abi_cxx11_.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + local_90));
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_128 = *plVar5;
            lStack_120 = plVar4[3];
            local_138 = &local_128;
          }
          else {
            local_128 = *plVar5;
            local_138 = (long *)*plVar4;
          }
          local_130 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_138,local_130,0,'\x01');
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_108 = *plVar5;
            lStack_100 = plVar4[3];
            local_118 = &local_108;
          }
          else {
            local_108 = *plVar5;
            local_118 = (long *)*plVar4;
          }
          local_110 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_118,
                                      *(ulong *)((long)&poker_dict_abi_cxx11_.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + local_98));
          local_158 = &local_148;
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_148 = *plVar5;
            lStack_140 = plVar4[3];
          }
          else {
            local_148 = *plVar5;
            local_158 = (long *)*plVar4;
          }
          local_150 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_158,local_150,0,'\x01');
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_60 = *plVar5;
            lStack_58 = plVar4[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar5;
            local_70 = (long *)*plVar4;
          }
          local_68 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,
                                      *(ulong *)((long)&poker_dict_abi_cxx11_.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  _M_dataplus._M_p + local_a0));
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_40 = *plVar5;
            lStack_38 = plVar4[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar5;
            local_50 = (long *)*plVar4;
          }
          local_48 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_a8,(string *)&local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138);
          }
          if (local_178 != local_168) {
            operator_delete(local_178);
          }
          uVar7 = local_78;
          dVar12 = local_b0;
          dVar13 = local_b8;
          dVar14 = local_c0;
          dVar15 = local_c8;
          dVar16 = local_d0;
          dVar17 = local_d8;
          if ((local_80 & 1) == 0) goto LAB_00103b23;
          goto LAB_00103b09;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      bVar10 = 2 < uVar9;
      uVar9 = uVar9 + 1;
      uVar6 = (ulong)bVar10;
    } while (uVar9 != 4);
LAB_00103b09:
    local_179 = uVar7 < 3;
    uVar7 = uVar7 + 1;
    if (uVar7 == 4) {
LAB_00103b23:
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
      return local_179;
    }
  } while( true );
}

Assistant:

bool jiesuan(int a,int b,int c,int d, string &  cal)
{
    string pos="+-*/";
    for (int i=0;i<4;i++)
    {
        for (int j=0;j<4;j++)
        {
            for (int k=0;k<4;k++)
            {
               if (cal_24(cal_24(cal_24(a,pos[i],b),pos[j],c),pos[k],d) == 24.0000)
               {
                   cal = poker_dict[a-1]+pos[i]+poker_dict[b-1]+pos[j]+poker_dict[c-1]+pos[k]+poker_dict[d-1];
                   return true;
               } 
            }
        }
    }
    return false;
}